

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Shift
                  (Image *__return_storage_ptr__,ShiftForm4 shift,Image *in,double shiftX,
                  double shiftY)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*shift)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
           __return_storage_ptr__->_height,shiftX,shiftY);
  return __return_storage_ptr__;
}

Assistant:

Image Shift( FunctionTable::ShiftForm4 shift,
                 const Image & in, double shiftX, double shiftY )
    {
        Image_Function::ParameterValidation( in );
        Image out = in.generate( in.width(), in.height() );

        shift( in, 0, 0, out, 0, 0, out.width(), out.height(), shiftX, shiftY );
        return out;
    }